

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepInterface.h
# Opt level: O3

void __thiscall
gurkenlaeufer::detail::CommonStep<gurkenlaeufer::detail::BaseStep>::CommonStep
          (CommonStep<gurkenlaeufer::detail::BaseStep> *this,string *RegEx,BaseStep *Step)

{
  size_t *psVar1;
  pointer pbVar2;
  pointer pcVar3;
  StepRegistry *pSVar4;
  _List_node_base *p_Var5;
  undefined1 local_58 [24];
  _List_node_base *p_Stack_40;
  _List_node_base *local_38;
  
  this->_vptr_CommonStep = (_func_int **)&PTR__CommonStep_00197e88;
  (this->_stepContext)._params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_stepContext)._params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stepContext)._params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._16_8_ = (pointer)0x0;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  (this->_stepContext)._currentParamIdx = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  pSVar4 = getStepRegistry_abi_cxx11_();
  pbVar2 = (pointer)(local_58 + 0x10);
  pcVar3 = (RegEx->_M_dataplus)._M_p;
  local_58._0_8_ = pbVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar3,pcVar3 + RegEx->_M_string_length);
  local_38 = (_List_node_base *)Step;
  p_Var5 = (_List_node_base *)operator_new(0x38);
  p_Var5[1]._M_next = p_Var5 + 2;
  if ((pointer)local_58._0_8_ == pbVar2) {
    p_Var5[2]._M_next = (_List_node_base *)local_58._16_8_;
    p_Var5[2]._M_prev = p_Stack_40;
  }
  else {
    p_Var5[1]._M_next = (_List_node_base *)local_58._0_8_;
    p_Var5[2]._M_next = (_List_node_base *)local_58._16_8_;
  }
  p_Var5[1]._M_prev = (_List_node_base *)local_58._8_8_;
  local_58._8_8_ = (pointer)0x0;
  local_58._16_8_ = local_58._16_8_ & 0xffffffffffffff00;
  p_Var5[3]._M_next = local_38;
  local_58._0_8_ = pbVar2;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(pSVar4->
            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((pointer)local_58._0_8_ != pbVar2) {
    operator_delete((void *)local_58._0_8_);
  }
  return;
}

Assistant:

CommonStep(std::string RegEx, TStep* Step)
            : _stepContext({})
        {
            getStepRegistry().emplace_back(std::make_pair(RegEx, Step));
        }